

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileOptions::MergePartialFromCodedStream
          (FileOptions *this,CodedInputStream *input)

{
  UnknownFieldSet *unknown_fields;
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  Type *value;
  uint8 *puVar5;
  uint32 tag;
  uint32 temp;
  RepeatedPtrFieldBase *local_38;
  
  unknown_fields = &this->_unknown_fields_;
  local_38 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase;
LAB_001f645c:
  puVar5 = input->buffer_;
  if ((puVar5 < input->buffer_end_) && (tag = (uint32)(char)*puVar5, -1 < (char)*puVar5)) {
    input->last_tag_ = tag;
    input->buffer_ = puVar5 + 1;
  }
  else {
    tag = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = tag;
  }
  if (tag == 0) {
    return true;
  }
  uVar3 = tag & 7;
  switch(tag >> 3) {
  case 1:
    if (uVar3 == 2) {
      psVar4 = mutable_java_package_abi_cxx11_(this);
      bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
      if (!bVar2) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->java_package_->_M_dataplus)._M_p,(int)this->java_package_->_M_string_length,
                 PARSE);
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (*puVar5 == 'B')) {
        input->buffer_ = puVar5 + 1;
LAB_001f6564:
        psVar4 = mutable_java_outer_classname_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
        if (!bVar2) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->java_outer_classname_->_M_dataplus)._M_p,
                   (int)this->java_outer_classname_->_M_string_length,PARSE);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (*puVar5 == 'H')) {
          input->buffer_ = puVar5 + 1;
LAB_001f65ae:
          bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
          if (!bVar2) {
            return false;
          }
          if (temp - 1 < 3) {
            set_optimize_for(this,temp);
          }
          else {
            UnknownFieldSet::AddVarint(unknown_fields,9,(long)(int)temp);
          }
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (*puVar5 == 'P')) {
            input->buffer_ = puVar5 + 1;
LAB_001f6656:
            bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
            if (!bVar2) {
              return false;
            }
            this->java_multiple_files_ = temp != 0;
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
            puVar5 = input->buffer_;
            if ((puVar5 < input->buffer_end_) && (*puVar5 == 'Z')) {
              input->buffer_ = puVar5 + 1;
LAB_001f669b:
              psVar4 = mutable_go_package_abi_cxx11_(this);
              bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
              if (!bVar2) {
                return false;
              }
              internal::WireFormat::VerifyUTF8StringFallback
                        ((this->go_package_->_M_dataplus)._M_p,
                         (int)this->go_package_->_M_string_length,PARSE);
            }
          }
        }
      }
      goto LAB_001f645c;
    }
    break;
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x13:
    break;
  case 8:
    if (uVar3 == 2) goto LAB_001f6564;
    break;
  case 9:
    if (uVar3 == 0) goto LAB_001f65ae;
    break;
  case 10:
    if (uVar3 == 0) goto LAB_001f6656;
    break;
  case 0xb:
    if (uVar3 == 2) goto LAB_001f669b;
    break;
  case 0x10:
    if (uVar3 != 0) break;
    bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
    if (!bVar2) {
      return false;
    }
    this->cc_generic_services_ = temp != 0;
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
    puVar5 = input->buffer_;
    if (((1 < *(int *)&input->buffer_end_ - (int)puVar5) && (*puVar5 == 0x88)) &&
       (puVar5[1] == '\x01')) {
      input->buffer_ = puVar5 + 2;
LAB_001f6749:
      bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
      if (!bVar2) {
        return false;
      }
      this->java_generic_services_ = temp != 0;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x80;
      puVar5 = input->buffer_;
      if (((1 < *(int *)&input->buffer_end_ - (int)puVar5) && (*puVar5 == 0x90)) &&
         (puVar5[1] == '\x01')) {
        input->buffer_ = puVar5 + 2;
LAB_001f679d:
        bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
        if (!bVar2) {
          return false;
        }
        this->py_generic_services_ = temp != 0;
        pbVar1 = (byte *)((long)this->_has_bits_ + 1);
        *pbVar1 = *pbVar1 | 1;
        puVar5 = input->buffer_;
        if (((1 < *(int *)&input->buffer_end_ - (int)puVar5) && (*puVar5 == 0xa0)) &&
           (puVar5[1] == '\x01')) {
          input->buffer_ = puVar5 + 2;
LAB_001f67f1:
          bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
          if (!bVar2) {
            return false;
          }
          this->java_generate_equals_and_hash_ = temp != 0;
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
          puVar5 = input->buffer_;
          if (((1 < *(int *)&input->buffer_end_ - (int)puVar5) && (*puVar5 == 0xba)) &&
             (puVar5[1] == '>')) {
            do {
              input->buffer_ = puVar5 + 2;
LAB_001f683f:
              value = internal::RepeatedPtrFieldBase::
                      Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                                (local_38);
              bVar2 = internal::WireFormatLite::
                      ReadMessageNoVirtual<google::protobuf::UninterpretedOption>(input,value);
              if (!bVar2) {
                return false;
              }
              puVar5 = input->buffer_;
            } while (((1 < *(int *)&input->buffer_end_ - (int)puVar5) && (*puVar5 == 0xba)) &&
                    (puVar5[1] == '>'));
            bVar2 = io::CodedInputStream::ExpectAtEnd(input);
            if (bVar2) {
              return true;
            }
          }
        }
      }
    }
    goto LAB_001f645c;
  case 0x11:
    if (uVar3 == 0) goto LAB_001f6749;
    break;
  case 0x12:
    if (uVar3 == 0) goto LAB_001f679d;
    break;
  case 0x14:
    if (uVar3 == 0) goto LAB_001f67f1;
    break;
  default:
    if ((tag >> 3 == 999) && (uVar3 == 2)) goto LAB_001f683f;
  }
  if (uVar3 == 4) {
    return true;
  }
  if (tag < 8000) {
    bVar2 = internal::WireFormat::SkipField(input,tag,unknown_fields);
  }
  else {
    bVar2 = internal::ExtensionSet::ParseField
                      (&this->_extensions_,tag,input,default_instance_,unknown_fields);
  }
  if (bVar2 == false) {
    return false;
  }
  goto LAB_001f645c;
}

Assistant:

bool FileOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string java_package = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->java_package().data(), this->java_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_java_outer_classname;
        break;
      }

      // optional string java_outer_classname = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_java_outer_classname:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_outer_classname()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->java_outer_classname().data(), this->java_outer_classname().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(72)) goto parse_optimize_for;
        break;
      }

      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_optimize_for:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FileOptions_OptimizeMode_IsValid(value)) {
            set_optimize_for(static_cast< ::google::protobuf::FileOptions_OptimizeMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(9, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_java_multiple_files;
        break;
      }

      // optional bool java_multiple_files = 10 [default = false];
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_multiple_files:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_multiple_files_)));
          set_has_java_multiple_files();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(90)) goto parse_go_package;
        break;
      }

      // optional string go_package = 11;
      case 11: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_go_package:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_go_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->go_package().data(), this->go_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(128)) goto parse_cc_generic_services;
        break;
      }

      // optional bool cc_generic_services = 16 [default = false];
      case 16: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_cc_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_generic_services_)));
          set_has_cc_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(136)) goto parse_java_generic_services;
        break;
      }

      // optional bool java_generic_services = 17 [default = false];
      case 17: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generic_services_)));
          set_has_java_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(144)) goto parse_py_generic_services;
        break;
      }

      // optional bool py_generic_services = 18 [default = false];
      case 18: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_py_generic_services:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &py_generic_services_)));
          set_has_py_generic_services();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(160)) goto parse_java_generate_equals_and_hash;
        break;
      }

      // optional bool java_generate_equals_and_hash = 20 [default = false];
      case 20: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_java_generate_equals_and_hash:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generate_equals_and_hash_)));
          set_has_java_generate_equals_and_hash();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}